

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

string * __thiscall
t_php_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_type *type,t_const_value *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  _func_int *p_Var3;
  long lVar4;
  long lVar5;
  size_t __n;
  _Alloc_hider _Var6;
  string *psVar7;
  t_php_generator *ptVar8;
  int iVar9;
  t_const_value_type tVar10;
  t_type *ptVar11;
  ostream *poVar12;
  undefined4 extraout_var;
  t_type *ptVar13;
  int64_t iVar14;
  _Base_ptr p_Var15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_00;
  long *plVar16;
  _Rb_tree_header *p_Var17;
  size_type *psVar18;
  pointer pptVar19;
  char *pcVar20;
  _func_int **pp_Var21;
  t_type *type_00;
  bool bVar22;
  undefined1 auVar23 [12];
  ostringstream out;
  string local_220;
  t_type *local_200;
  string *local_1f8;
  t_php_generator *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  ptVar11 = t_type::get_true_type(type);
  iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[5])();
  if ((char)iVar9 == '\0') {
    iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[10])();
    if ((char)iVar9 == '\0') {
      iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[0xb])();
      if (((char)iVar9 == '\0') &&
         (iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[0xc])(), (char)iVar9 == '\0')) {
        iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[0x10])();
        if ((char)iVar9 == '\0') {
          iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[0xe])();
          if (((char)iVar9 != '\0') ||
             (iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[0xf])(), (char)iVar9 != '\0')) {
            (*(ptVar11->super_t_doc)._vptr_t_doc[0xe])();
            local_200 = *(t_type **)&ptVar11[1].super_t_doc.has_doc_;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"array(",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
            iVar9 = (this->super_t_oop_generator).super_t_generator.indent_;
            (this->super_t_oop_generator).super_t_generator.indent_ = iVar9 + 1;
            pptVar19 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar19 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              do {
                t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                           local_220._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                render_const_value_abi_cxx11_(&local_220,this,local_200,*pptVar19);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                           local_220._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[0xf])();
                if ((char)iVar9 != '\0') {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8," => true",8);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
                pptVar19 = pptVar19 + 1;
              } while (pptVar19 !=
                       (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
              iVar9 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
            }
            (this->super_t_oop_generator).super_t_generator.indent_ = iVar9;
            poVar12 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
          }
        }
        else {
          local_200 = *(t_type **)&ptVar11[1].super_t_doc.has_doc_;
          ptVar11 = *(t_type **)&ptVar11[1].annotations_._M_t._M_impl;
          local_1f8 = __return_storage_ptr__;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"array(",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_string_length);
          iVar9 = (this->super_t_oop_generator).super_t_generator.indent_;
          (this->super_t_oop_generator).super_t_generator.indent_ = iVar9 + 1;
          p_Var15 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var17 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var15 != p_Var17) {
            paVar1 = &local_220.field_2;
            do {
              t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != paVar1) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              render_const_value_abi_cxx11_
                        (&local_220,this,local_200,*(t_const_value **)(p_Var15 + 1));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != paVar1) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," => ",4);
              render_const_value_abi_cxx11_
                        (&local_220,this,ptVar11,(t_const_value *)p_Var15[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != paVar1) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
            } while ((_Rb_tree_header *)p_Var15 != p_Var17);
            iVar9 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
          }
          (this->super_t_oop_generator).super_t_generator.indent_ = iVar9;
          poVar12 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
          __return_storage_ptr__ = local_1f8;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"new ",4);
        php_namespace_abi_cxx11_(&local_220,this,ptVar11->program_);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                             local_220._M_string_length);
        iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[3])();
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,*(char **)CONCAT44(extraout_var,iVar9),
                             ((undefined8 *)CONCAT44(extraout_var,iVar9))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(array(",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        paVar1 = &local_220.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != paVar1) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        iVar9 = (this->super_t_oop_generator).super_t_generator.indent_;
        (this->super_t_oop_generator).super_t_generator.indent_ = iVar9 + 1;
        ptVar13 = (t_type *)(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_200 = (t_type *)&(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        psVar7 = __return_storage_ptr__;
        ptVar8 = this;
        if (ptVar13 != local_200) {
          do {
            local_1f0 = ptVar8;
            local_1f8 = psVar7;
            pp_Var21 = ptVar11[1].super_t_doc._vptr_t_doc;
            if (pp_Var21 == (_func_int **)ptVar11[1].super_t_doc.doc_._M_dataplus._M_p) {
LAB_002f6fce:
              __return_storage_ptr___00 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
              iVar9 = (*(ptVar11->super_t_doc)._vptr_t_doc[3])();
              std::operator+(&local_1e8,"type error: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar9));
              plVar16 = (long *)std::__cxx11::string::append((char *)&local_1e8);
              local_220._M_dataplus._M_p = (pointer)*plVar16;
              psVar18 = (size_type *)(plVar16 + 2);
              if ((size_type *)local_220._M_dataplus._M_p == psVar18) {
                local_220.field_2._M_allocated_capacity = *psVar18;
                local_220.field_2._8_4_ = (undefined4)plVar16[3];
                local_220.field_2._12_4_ = *(undefined4 *)((long)plVar16 + 0x1c);
                local_220._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_220.field_2._M_allocated_capacity = *psVar18;
              }
              local_220._M_string_length = plVar16[1];
              *plVar16 = (long)psVar18;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              lVar4 = *(long *)((long)&(ptVar13->super_t_doc).doc_.field_2 + 8);
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              lVar5 = *(long *)(lVar4 + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c8,lVar5,*(long *)(lVar4 + 0x50) + lVar5);
              std::operator+(__return_storage_ptr___00,&local_220,&local_1c8);
              __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                          std::__cxx11::string::~string);
            }
            type_00 = (t_type *)0x0;
            do {
              p_Var3 = *pp_Var21;
              lVar4 = *(long *)((long)&(ptVar13->super_t_doc).doc_.field_2 + 8);
              lVar5 = *(long *)(lVar4 + 0x48);
              local_220._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_220,lVar5,*(long *)(lVar4 + 0x50) + lVar5);
              _Var6._M_p = local_220._M_dataplus._M_p;
              __n = *(size_t *)(p_Var3 + 0x70);
              if (__n == local_220._M_string_length) {
                if (__n == 0) {
                  bVar22 = true;
                }
                else {
                  iVar9 = bcmp(*(void **)(p_Var3 + 0x68),local_220._M_dataplus._M_p,__n);
                  bVar22 = iVar9 == 0;
                }
              }
              else {
                bVar22 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p != paVar1) {
                operator_delete(_Var6._M_p);
              }
              this = local_1f0;
              if (bVar22) {
                type_00 = *(t_type **)(*pp_Var21 + 0x60);
              }
              pp_Var21 = pp_Var21 + 1;
            } while (pp_Var21 != (_func_int **)ptVar11[1].super_t_doc.doc_._M_dataplus._M_p);
            if (type_00 == (t_type *)0x0) goto LAB_002f6fce;
            t_generator::indent_abi_cxx11_(&local_220,(t_generator *)local_1f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar1) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            render_const_value_abi_cxx11_
                      (&local_220,this,g_type_string,
                       *(t_const_value **)((long)&(ptVar13->super_t_doc).doc_.field_2 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar1) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," => ",4);
            render_const_value_abi_cxx11_
                      (&local_220,this,type_00,*(t_const_value **)&(ptVar13->super_t_doc).has_doc_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar1) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
            ptVar13 = (t_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)ptVar13);
            psVar7 = local_1f8;
            ptVar8 = local_1f0;
          } while (ptVar13 != local_200);
          iVar9 = (this->super_t_oop_generator).super_t_generator.indent_ + -1;
          __return_storage_ptr__ = local_1f8;
        }
        (this->super_t_oop_generator).super_t_generator.indent_ = iVar9;
        poVar12 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"))",2);
      }
    }
    else {
      poVar12 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)poVar12);
    }
  }
  else {
    uVar2 = *(uint *)&ptVar11[1].super_t_doc._vptr_t_doc;
    switch(uVar2) {
    case 1:
      local_220._M_dataplus._M_p._0_1_ = 0x22;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)&local_220,1);
      t_generator::get_escaped_string_abi_cxx11_(&local_220,(t_generator *)this,value);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,local_220._M_dataplus._M_p,local_220._M_string_length);
      local_1e8._M_dataplus._M_p._0_1_ = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_1e8,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      break;
    case 2:
      iVar14 = t_const_value::get_integer(value);
      pcVar20 = "false";
      if (0 < iVar14) {
        pcVar20 = "true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar20,(ulong)(0 < iVar14) ^ 5);
      break;
    case 7:
      tVar10 = t_const_value::get_type(value);
      if (tVar10 != CV_INTEGER) {
        std::ostream::_M_insert<double>(value->doubleVal_);
        break;
      }
    case 3:
    case 4:
    case 5:
    case 6:
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)local_1a8);
      break;
    default:
      auVar23 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_220,(t_base_type *)(ulong)uVar2,auVar23._8_4_);
      std::operator+(auVar23._0_8_,"compiler error: no const of base type ",&local_220);
      __cxa_throw(auVar23._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string t_php_generator::render_const_value(t_type* type, t_const_value* value) {
  std::ostringstream out;
  type = get_true_type(type);
  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    indent(out) << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << "new " << php_namespace(type->get_program()) << type->get_name() << "(array(" << endl;
    indent_up();
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      out << indent();
      out << render_const_value(g_type_string, v_iter->first);
      out << " => ";
      out << render_const_value(field_type, v_iter->second);
      out << "," << endl;
    }
    indent_down();
    indent(out) << "))";
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    out << "array(" << endl;
    indent_up();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent();
      out << render_const_value(ktype, v_iter->first);
      out << " => ";
      out << render_const_value(vtype, v_iter->second);
      out << "," << endl;
    }
    indent_down();
    indent(out) << ")";
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    out << "array(" << endl;
    indent_up();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      out << indent();
      out << render_const_value(etype, *v_iter);
      if (type->is_set()) {
        out << " => true";
      }
      out << "," << endl;
    }
    indent_down();
    indent(out) << ")";
  }
  return out.str();
}